

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

bool __thiscall mpt::object::attribute::set(attribute *this,convertable *val)

{
  int iVar1;
  convertable *val_local;
  attribute *this_local;
  
  if ((this->_prop).name == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = (*this->_obj->_vptr_object[1])(this->_obj,(this->_prop).name,val);
    if (iVar1 < 0) {
      this_local._7_1_ = false;
    }
    else {
      iVar1 = (**this->_obj->_vptr_object)();
      if (iVar1 < 0) {
        (this->_prop).name = (char *)0x0;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool object::attribute::set(convertable &val)
{
	if (!_prop.name) {
		return false;
	}
	if (_obj.set_property(_prop.name, &val) < 0) {
		return false;
	}
	if (_obj.property(&_prop) < 0) {
		_prop.name = 0;
	}
	return true;
}